

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hackdemo.cpp
# Opt level: O0

int main(void)

{
  proto p_Var1;
  ostream *poVar2;
  undefined1 local_60 [8];
  hackfunc<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_hackdemo_cpp:23:7),_void>
  fn2;
  int binding;
  undefined1 local_28 [8];
  hackfunc<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_hackdemo_cpp:16:7),_void>
  fn;
  
  func_ptr::
  hackfunc<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/hackdemo.cpp:16:7),_void>
  ::hackfunc();
  p_Var1 = func_ptr::hackfunc::operator_cast_to_function_pointer((hackfunc *)local_28);
  fake_clib_func(p_Var1);
  func_ptr::
  hackfunc<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/hackdemo.cpp:23:7),_void>
  ::hackfunc((hackfunc<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_hackdemo_cpp:23:7),_void>
              *)local_60,
             (anon_class_8_1_7ce6e165)
             &fn2.super_hackfunc<std::function<void_(int)>,_void>.storage._M_invoker);
  p_Var1 = func_ptr::hackfunc::operator_cast_to_function_pointer((hackfunc *)local_60);
  fake_clib_func(p_Var1);
  poVar2 = std::operator<<((ostream *)&std::cout,"[main] got ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(int)fn2.super_hackfunc<std::function<void_(int)>,_void>.storage.
                                  _M_invoker);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  func_ptr::
  hackfunc<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/hackdemo.cpp:23:7),_void>
  ::~hackfunc((hackfunc<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_hackdemo_cpp:23:7),_void>
               *)local_60);
  func_ptr::
  hackfunc<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/hackdemo.cpp:16:7),_void>
  ::~hackfunc((hackfunc<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_hackdemo_cpp:16:7),_void>
               *)local_28);
  return 0;
}

Assistant:

int main() {
  hackfunc fn{
      [](int input) { std::cout << "directly: " << input << std::endl; }};
  
  fake_clib_func(fn);

  int binding;

  hackfunc fn2{
      [&](int input) { binding = input; }};
  
  fake_clib_func(fn2);
  std::cout << "[main] got " << binding << std::endl;
}